

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O0

bool __thiscall
GaussianEdgeCalculator::edgeBetween
          (GaussianEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,
          int numGCAllowedPos,int ct)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  runtime_error *this_00;
  size_t sVar4;
  double *pdVar5;
  int iVar6;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  long in_RDI;
  double interedge;
  double mean_insert_length;
  size_t intersection_length;
  double insert_length_diff;
  AlignmentRecord *in_stack_ffffffffffffff98;
  AlignmentRecord *in_stack_ffffffffffffffa0;
  GaussianEdgeCalculator *in_stack_ffffffffffffffa8;
  bool local_1;
  
  bVar1 = AlignmentRecord::isSingleEnd(in_RSI);
  if (!bVar1) {
    bVar1 = AlignmentRecord::isSingleEnd(in_RDX);
    if (!bVar1) {
      uVar2 = AlignmentRecord::getInsertLength(in_RSI);
      uVar3 = AlignmentRecord::getInsertLength(in_RDX);
      iVar6 = uVar2 - uVar3;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      if ((double)iVar6 <= (double)*(int *)(in_RDI + 0x20)) {
        sVar4 = AlignmentRecord::internalSegmentIntersectionLength
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if (sVar4 == 0) {
          local_1 = false;
        }
        else {
          AlignmentRecord::getInsertLength(in_RSI);
          AlignmentRecord::getInsertLength(in_RDX);
          sf(in_stack_ffffffffffffffa8,1.0);
          pdVar5 = std::min<double>((double *)&stack0xffffffffffffffa0,
                                    (double *)&stack0xffffffffffffff98);
          local_1 = *(double *)(in_RDI + 8) <= *pdVar5;
        }
      }
      else {
        local_1 = false;
      }
      return local_1;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Cannot process single-end reads in GaussianEdgeCalculator!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool GaussianEdgeCalculator::edgeBetween(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int numGCAllowedPos, int ct) const {
	if (ap1.isSingleEnd() || ap2.isSingleEnd()) {
		throw runtime_error("Cannot process single-end reads in GaussianEdgeCalculator!");
	}
	double insert_length_diff = abs(((int)ap1.getInsertLength()) - ((int)ap2.getInsertLength()));
	// double meanedge = 2.0 * sf( insert_length_diff / (sqrt2*insert_size_popstddev) );
	if (insert_length_diff > allowable_insert_size_diff) {
		return false;
	}
	size_t intersection_length = ap1.internalSegmentIntersectionLength(ap2);
	if (intersection_length == 0) return false;
	double mean_insert_length = (ap1.getInsertLength() + ap2.getInsertLength()) / 2.0;
	double interedge = min(1.0, 2.0 * sf(sqrt2*(mean_insert_length - intersection_length - insert_size_popmean) / insert_size_popstddev) );
	return interedge >= significance_level;
}